

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int mbedtls_pk_parse_public_key(mbedtls_pk_context *ctx,uchar *key,size_t keylen)

{
  int iVar1;
  mbedtls_pk_info_t *pmVar2;
  uchar *end;
  uchar *p;
  mbedtls_pem_context pem;
  size_t len;
  uchar *local_48;
  mbedtls_pem_context local_40;
  size_t local_28;
  
  if (keylen == 0) {
    return -0x3d00;
  }
  mbedtls_pem_init(&local_40);
  iVar1 = -0x1080;
  if (key[keylen - 1] == '\0') {
    iVar1 = mbedtls_pem_read_buffer
                      (&local_40,"-----BEGIN RSA PUBLIC KEY-----","-----END RSA PUBLIC KEY-----",key
                       ,(uchar *)0x0,0,&local_28);
  }
  if (iVar1 == -0x1080) {
    end = key + keylen;
    iVar1 = -0x1080;
    if (end[-1] == '\0') {
      iVar1 = mbedtls_pem_read_buffer
                        (&local_40,"-----BEGIN PUBLIC KEY-----","-----END PUBLIC KEY-----",key,
                         (uchar *)0x0,0,&local_28);
    }
    if (iVar1 == -0x1080) {
      mbedtls_pem_free(&local_40);
      pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
      if (pmVar2 == (mbedtls_pk_info_t *)0x0) {
        return -0x3c80;
      }
      iVar1 = mbedtls_pk_setup(ctx,pmVar2);
      if (iVar1 != 0) {
        return iVar1;
      }
      local_48 = key;
      iVar1 = pk_get_rsapubkey(&local_48,end,(mbedtls_rsa_context *)ctx->pk_ctx);
      if (iVar1 == 0) {
        return 0;
      }
      mbedtls_pk_free(ctx);
      if (iVar1 == -0x3b62) {
        local_48 = key;
        iVar1 = mbedtls_pk_parse_subpubkey(&local_48,end,ctx);
        return iVar1;
      }
      return iVar1;
    }
    if (iVar1 == 0) {
      local_48 = local_40.buf;
      iVar1 = mbedtls_pk_parse_subpubkey(&local_48,local_40.buf + local_40.buflen,ctx);
    }
  }
  else if (iVar1 == 0) {
    local_48 = local_40.buf;
    pmVar2 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
    if (pmVar2 == (mbedtls_pk_info_t *)0x0) {
      return -0x3c80;
    }
    iVar1 = mbedtls_pk_setup(ctx,pmVar2);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = pk_get_rsapubkey(&local_48,local_48 + local_40.buflen,(mbedtls_rsa_context *)ctx->pk_ctx
                            );
    if (iVar1 != 0) {
      mbedtls_pk_free(ctx);
    }
  }
  mbedtls_pem_free(&local_40);
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_public_key( mbedtls_pk_context *ctx,
                         const unsigned char *key, size_t keylen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p;
#if defined(MBEDTLS_RSA_C)
    const mbedtls_pk_info_t *pk_info;
#endif
#if defined(MBEDTLS_PEM_PARSE_C)
    size_t len;
    mbedtls_pem_context pem;
#endif

    PK_VALIDATE_RET( ctx != NULL );
    if( keylen == 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
    PK_VALIDATE_RET( key != NULL || keylen == 0 );

#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_init( &pem );
#if defined(MBEDTLS_RSA_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                               "-----BEGIN RSA PUBLIC KEY-----",
                               "-----END RSA PUBLIC KEY-----",
                               key, NULL, 0, &len );

    if( ret == 0 )
    {
        p = pem.buf;
        if( ( pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_RSA ) ) == NULL )
            return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

        if( ( ret = mbedtls_pk_setup( ctx, pk_info ) ) != 0 )
            return( ret );

        if ( ( ret = pk_get_rsapubkey( &p, p + pem.buflen, mbedtls_pk_rsa( *ctx ) ) ) != 0 )
            mbedtls_pk_free( ctx );

        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
    {
        mbedtls_pem_free( &pem );
        return( ret );
    }
#endif /* MBEDTLS_RSA_C */

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if( key[keylen - 1] != '\0' )
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    else
        ret = mbedtls_pem_read_buffer( &pem,
                "-----BEGIN PUBLIC KEY-----",
                "-----END PUBLIC KEY-----",
                key, NULL, 0, &len );

    if( ret == 0 )
    {
        /*
         * Was PEM encoded
         */
        p = pem.buf;

        ret = mbedtls_pk_parse_subpubkey( &p,  p + pem.buflen, ctx );
        mbedtls_pem_free( &pem );
        return( ret );
    }
    else if( ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT )
    {
        mbedtls_pem_free( &pem );
        return( ret );
    }
    mbedtls_pem_free( &pem );
#endif /* MBEDTLS_PEM_PARSE_C */

#if defined(MBEDTLS_RSA_C)
    if( ( pk_info = mbedtls_pk_info_from_type( MBEDTLS_PK_RSA ) ) == NULL )
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    if( ( ret = mbedtls_pk_setup( ctx, pk_info ) ) != 0 )
        return( ret );

    p = (unsigned char *)key;
    ret = pk_get_rsapubkey( &p, p + keylen, mbedtls_pk_rsa( *ctx ) );
    if( ret == 0 )
    {
        return( ret );
    }
    mbedtls_pk_free( ctx );
    if( ret != ( MBEDTLS_ERR_PK_INVALID_PUBKEY + MBEDTLS_ERR_ASN1_UNEXPECTED_TAG ) )
    {
        return( ret );
    }
#endif /* MBEDTLS_RSA_C */
    p = (unsigned char *) key;

    ret = mbedtls_pk_parse_subpubkey( &p, p + keylen, ctx );

    return( ret );
}